

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

uint __thiscall EventLoop::fireSocket(EventLoop *this,int fd,uint mode)

{
  _Base_ptr p_Var1;
  undefined8 uVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  _Rb_tree_header *p_Var5;
  unique_lock<std::mutex> locker;
  function<void_(int,_unsigned_int)> callback;
  uint local_58;
  int local_54;
  unique_lock<std::mutex> local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_50._M_device = &this->mMutex;
  local_50._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_50);
  local_50._M_owns = true;
  p_Var1 = (this->mSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar4 = 0;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var5 = &(this->mSockets)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var5->_M_header;
    do {
      if (fd <= (int)p_Var1[1]._M_color) {
        p_Var3 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < fd];
    } while (p_Var1 != (_Base_ptr)0x0);
    uVar4 = 0;
    if (((_Rb_tree_header *)p_Var3 != p_Var5) && ((int)p_Var3[1]._M_color <= fd)) {
      std::function<void_(int,_unsigned_int)>::function
                ((function<void_(int,_unsigned_int)> *)&local_40,
                 (function<void_(int,_unsigned_int)> *)&p_Var3[1]._M_left);
      std::unique_lock<std::mutex>::unlock(&local_50);
      local_58 = mode;
      local_54 = fd;
      if (local_30 == (code *)0x0) {
        uVar2 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar2);
      }
      (*local_28)(&local_40,&local_54,&local_58);
      uVar4 = mode;
      if (local_30 != (code *)0x0) {
        (*local_30)(&local_40,&local_40,__destroy_functor);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  return uVar4;
}

Assistant:

unsigned int EventLoop::fireSocket(int fd, unsigned int mode)
{
    std::unique_lock<std::mutex> locker(mMutex);
    const auto socket = mSockets.find(fd);
    if (socket != mSockets.end()) {
        const auto callback = socket->second.second;
        locker.unlock();
        RCT_CALLBACK(callback(fd, mode));
        return mode;
    }
    return 0;
}